

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

ON_3dPoint *
ON_Texture::WcsBoxMapping(ON_3dPoint *__return_storage_ptr__,ON_3dPoint *pt,ON_3dVector *n)

{
  int __x;
  ON_3dPoint *pOVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double dVar2;
  double t1;
  int side1;
  ON_3dPoint *rst;
  int side0;
  ON_3dVector *n_local;
  ON_3dPoint *pt_local;
  
  pOVar1 = __return_storage_ptr__;
  std::abs((int)__return_storage_ptr__);
  __x = (int)pOVar1;
  std::abs(__x);
  t1._4_4_ = (uint)(extraout_XMM0_Qa < extraout_XMM0_Qa_00);
  std::abs(__x);
  std::abs(__x);
  if (extraout_XMM0_Qa_02 < extraout_XMM0_Qa_01) {
    t1._4_4_ = 2;
  }
  if (0.0 <= (&pt->x)[(int)t1._4_4_]) {
    rst._4_4_ = t1._4_4_ * 2 + 2;
  }
  else {
    rst._4_4_ = t1._4_4_ * 2 + 1;
  }
  std::abs(__x);
  std::abs(__x);
  t1._4_4_ = (uint)(extraout_XMM0_Qa_03 < extraout_XMM0_Qa_04);
  std::abs(__x);
  std::abs(__x);
  if (extraout_XMM0_Qa_06 < extraout_XMM0_Qa_05) {
    t1._4_4_ = 2;
  }
  dVar2 = ON_3dVector::operator[](n,t1._4_4_);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    if (0.0 <= dVar2) {
      if (0.0 < dVar2) {
        rst._4_4_ = t1._4_4_ * 2 + 2;
      }
    }
    else {
      rst._4_4_ = t1._4_4_ * 2 + 1;
    }
  }
  switch(rst._4_4_) {
  case 1:
    __return_storage_ptr__->x = -pt->y;
    __return_storage_ptr__->y = pt->z;
    __return_storage_ptr__->z = pt->x;
    break;
  case 2:
    __return_storage_ptr__->x = pt->y;
    __return_storage_ptr__->y = pt->z;
    __return_storage_ptr__->z = pt->x;
    break;
  case 3:
    __return_storage_ptr__->x = pt->x;
    __return_storage_ptr__->y = pt->z;
    __return_storage_ptr__->z = pt->y;
    break;
  case 4:
    __return_storage_ptr__->x = -pt->x;
    __return_storage_ptr__->y = pt->z;
    __return_storage_ptr__->z = pt->y;
    break;
  case 5:
    __return_storage_ptr__->x = -pt->x;
    __return_storage_ptr__->y = pt->y;
    __return_storage_ptr__->z = pt->z;
    break;
  case 6:
  default:
    __return_storage_ptr__->x = pt->x;
    __return_storage_ptr__->y = pt->y;
    __return_storage_ptr__->z = pt->z;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_Texture::WcsBoxMapping(const ON_3dPoint& pt, const ON_3dVector& n)
{
  // This code is moved here from CRhRdkTexture::WcsBoxMapping

  int side0 = 0;

  const ON_3dPoint& rst(pt);

  // set side0 = side closest to the point
  int side1 = (std::abs(rst.x) >= std::abs(rst.y)) ? 0 : 1;
  if (std::abs(rst.z) > std::abs(((double*)&rst.x)[side1]))
    side1 = 2;

  double t1 = (&rst.x)[side1];
  if (t1 < 0.0)
    side0 = 2 * side1 + 1;
  else
    side0 = 2 * side1 + 2;

  side1 = (std::abs(n.x) >= std::abs(n.y)) ? 0 : 1;
  if (std::abs(n.z) > std::abs((&n.x)[side1]))
  {
    side1 = 2;
  }

  t1 = n[side1];
  if (0.0 != t1)
  {
    if (t1 < 0.0)
      side0 = 2 * side1 + 1;
    else
      if (t1 > 0.0)
        side0 = 2 * side1 + 2;
  }

  // side flag
  //  1 =  left side (x=-1)
  //  2 =  right side (x=+1)
  //  3 =  back side (y=-1)
  //  4 =  front side (y=+1)
  //  5 =  bottom side (z=-1)
  //  6 =  top side (z=+1)
  ON_3dPoint v;
  switch (side0)
  {
  case 1:
    v.x = -pt.y;
    v.y = pt.z;
    v.z = pt.x;
    break;
  case 2:
    v.x = pt.y;
    v.y = pt.z;
    v.z = pt.x;
    break;
  case 3:
    v.x = pt.x;
    v.y = pt.z;
    v.z = pt.y;
    break;
  case 4:
    v.x = -pt.x;
    v.y = pt.z;
    v.z = pt.y;
    break;
  case 5:
    v.x = -pt.x;
    v.y = pt.y;
    v.z = pt.z;
    break;
  case 6:
  default:
    v.x = pt.x;
    v.y = pt.y;
    v.z = pt.z;
    break;
  }

  return v;
}